

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
kratos::extract_interface_info_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,kratos *this,Generator *top)

{
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  undefined1 *puVar2;
  InterfaceRef *this_00;
  long lVar3;
  int iVar4;
  size_type sVar5;
  ostream *poVar6;
  SystemVerilogCodeGen *this_01;
  _Base_ptr p_Var7;
  Var *this_02;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  UserException *this_03;
  _Rb_tree_node_base *p_Var10;
  Port *port;
  Var *var;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  uint uVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  ulong uVar13;
  basic_string_view<char> bVar14;
  string_view format_str;
  format_args args;
  allocator<char> local_358 [8];
  stringstream stream;
  InterfaceVisitor visitor;
  undefined8 local_108;
  _Base_ptr p_Stack_100;
  string local_f0 [8];
  string indent;
  shared_ptr<kratos::InterfaceDefinition> interface_definition;
  ulong local_98;
  undefined1 local_80 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  undefined1 *local_40;
  
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  stream._384_8_ = &PTR_visit_root_002ac4a8;
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
       (__node_base_ptr)&visitor.interfaces_._M_h._M_rehash_policy._M_next_resize;
  visitor.interfaces_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.interfaces_._M_h._M_bucket_count = 0;
  visitor.interfaces_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.interfaces_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.interfaces_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.interfaces_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.interfaces_._M_h._M_rehash_policy._M_next_resize = 0;
  visitor.interfaces_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  visitor.lock_.super___mutex_base._M_mutex.__align = 0;
  visitor.lock_.super___mutex_base._M_mutex._8_8_ = 0;
  visitor.lock_.super___mutex_base._M_mutex._16_8_ = 0;
  visitor.lock_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  IRVisitor::visit_generator_root_p((IRVisitor *)&stream.field_0x180,(Generator *)this);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"  ",local_358);
  puVar2 = &stream.field_0x8;
  sVar5 = visitor.interfaces_._M_h._M_bucket_count;
  do {
    if (sVar5 == 0) {
      std::__cxx11::string::~string(local_f0);
      InterfaceVisitor::~InterfaceVisitor((InterfaceVisitor *)&stream.field_0x180);
      return __return_storage_ptr__;
    }
    this_00 = *(InterfaceRef **)(sVar5 + 0x30);
    port_names._M_t._M_impl.super__Rb_tree_header._M_node_count = sVar5;
    iVar4 = (*((this_00->definition_).
               super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_IDefinition[8])();
    if ((char)iVar4 == '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_358);
      poVar6 = std::operator<<((ostream *)puVar2,"interface ");
      __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (port_names._M_t._M_impl.super__Rb_tree_header._M_node_count + 8);
      std::operator<<(poVar6,(string *)__args);
      (*((this_00->definition_).super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_IDefinition[4])
                ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_80);
      p_Var7 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_80);
      if (p_Var7 == (_Base_ptr)0x0) {
        poVar6 = std::operator<<((ostream *)puVar2,";");
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      else {
        poVar6 = std::operator<<((ostream *)puVar2,"(");
        std::endl<char,std::char_traits<char>>(poVar6);
        (*((this_00->definition_).
           super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_IDefinition[4])(local_80);
        local_40 = (undefined1 *)0x0;
        p_Var7 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        while (p_Var7 != (_Rb_tree_node_base *)&port_names) {
          this_01 = (SystemVerilogCodeGen *)InterfaceRef::port(this_00,(string *)(p_Var7 + 1));
          poVar6 = std::operator<<((ostream *)puVar2,local_f0);
          p_Var12 = &interface_definition.
                     super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
          SystemVerilogCodeGen::get_port_str_abi_cxx11_((string *)p_Var12,this_01,port);
          std::operator<<(poVar6,(string *)p_Var12);
          std::__cxx11::string::~string((string *)p_Var12);
          poVar6 = (ostream *)puVar2;
          if ((undefined1 *)
              ((long)&port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right[-1]._M_right
              + 7) != local_40) {
            poVar6 = std::operator<<((ostream *)puVar2,",");
          }
          std::endl<char,std::char_traits<char>>(poVar6);
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
          local_40 = (undefined1 *)(ulong)((int)local_40 + 1);
        }
        poVar6 = std::operator<<((ostream *)puVar2,");");
        std::endl<char,std::char_traits<char>>(poVar6);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_80);
      }
      (*((this_00->definition_).super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_IDefinition[5])(local_80);
      for (p_Var7 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var7 != (_Rb_tree_node_base *)&port_names;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        this_02 = InterfaceRef::var(this_00,(string *)(p_Var7 + 1));
        poVar6 = std::operator<<((ostream *)puVar2,local_f0);
        p_Var12 = &interface_definition.
                   super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        Stream::get_var_decl_abi_cxx11_((string *)p_Var12,(Stream *)this_02,var);
        poVar6 = std::operator<<(poVar6,(string *)p_Var12);
        poVar6 = std::operator<<(poVar6,";");
        std::endl<char,std::char_traits<char>>(poVar6);
        std::__cxx11::string::~string((string *)p_Var12);
      }
      std::static_pointer_cast<kratos::InterfaceDefinition,kratos::IDefinition>
                ((shared_ptr<kratos::IDefinition> *)((long)&indent.field_2 + 8));
      p_Var9 = *(_Rb_tree_node_base **)(indent.field_2._8_8_ + 0xb0);
      p_Var10 = (_Rb_tree_node_base *)(indent.field_2._8_8_ + 0xa0);
      while( true ) {
        p_Var12 = &interface_definition.
                   super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        if (p_Var9 == p_Var10) break;
        poVar6 = std::operator<<((ostream *)puVar2,local_f0);
        poVar6 = std::operator<<(poVar6,"modport ");
        poVar6 = std::operator<<(poVar6,(string *)(p_Var9 + 1));
        std::operator<<(poVar6,"(");
        (**(code **)(**(long **)(p_Var9 + 2) + 0x20))(p_Var12);
        if (local_98 == 0) {
          this_03 = (UserException *)__cxa_allocate_exception(0x10);
          local_108 = *(undefined8 *)(p_Var9 + 1);
          p_Stack_100 = p_Var9[1]._M_parent;
          bVar14 = fmt::v7::to_string_view<char,_0>("{0} is empty");
          format_str.data_ = (char *)bVar14.size_;
          format_str.size_ = 0xd;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_108;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)&visitor.lock_.super___mutex_base._M_mutex.__data.__list.__next,
                     (detail *)bVar14.data_,format_str,args);
          UserException::UserException
                    (this_03,(string *)
                             &visitor.lock_.super___mutex_base._M_mutex.__data.__list.__next);
          __cxa_throw(this_03,&UserException::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar3 = *(long *)(p_Var9 + 2);
        p_Var8 = *(_Rb_tree_node_base **)(lVar3 + 0x50);
        uVar13 = 0;
        uVar11 = 1;
        while (p_Var8 != (_Rb_tree_node_base *)(lVar3 + 0x40)) {
          poVar6 = std::operator<<((ostream *)puVar2,"input ");
          std::operator<<(poVar6,(string *)(p_Var8 + 1));
          uVar13 = (ulong)((int)uVar13 + 1);
          if (local_98 != uVar13) {
            std::operator<<((ostream *)puVar2,", ");
          }
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
          uVar11 = uVar11 + 1;
        }
        p_Var8 = *(_Rb_tree_node_base **)(lVar3 + 0x80);
        while (p_Var8 != (_Rb_tree_node_base *)(lVar3 + 0x70)) {
          poVar6 = std::operator<<((ostream *)puVar2,"output ");
          std::operator<<(poVar6,(string *)(p_Var8 + 1));
          if (local_98 != uVar11) {
            std::operator<<((ostream *)puVar2,", ");
          }
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
          uVar11 = uVar11 + 1;
        }
        poVar6 = std::operator<<((ostream *)puVar2,");");
        std::endl<char,std::char_traits<char>>(poVar6);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&interface_definition.
                        super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
      }
      poVar6 = std::operator<<((ostream *)puVar2,"endinterface");
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::stringbuf::str();
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)__return_storage_ptr__,__args,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var12);
      std::__cxx11::string::~string((string *)p_Var12);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&interface_definition);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_80);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_358);
    }
    sVar5 = *(size_type *)port_names._M_t._M_impl.super__Rb_tree_header._M_node_count;
  } while( true );
}

Assistant:

std::map<std::string, std::string> extract_interface_info(Generator* top) {
    InterfaceVisitor visitor;
    visitor.visit_generator_root_p(top);
    auto const& defs = visitor.interfaces();
    std::map<std::string, std::string> result;
    const std::string indent = "  ";
    for (auto const& [interface_name, def] : defs) {
        const auto* i_ref = def.second;
        auto const& i_def = i_ref->definition();
        if (i_def->is_modport())
            // don't generate mod port definition
            continue;
        std::stringstream stream;
        stream << "interface " << interface_name;
        if (!i_def->ports().empty()) {
            stream << "(" << std::endl;
            auto port_names = i_def->ports();
            uint32_t i = 0;
            for (auto const& port_name : port_names) {
                auto* p = &i_ref->port(port_name);
                stream << indent << SystemVerilogCodeGen::get_port_str(p);
                if (i++ == port_names.size() - 1)
                    stream << std::endl;
                else
                    stream << "," << std::endl;
            }
            stream << ");" << std::endl;
        } else {
            stream << ";" << std::endl;
        }
        // output vars
        auto const& vars = i_def->vars();
        for (auto const& var_name : vars) {
            auto* v = &i_ref->var(var_name);
            stream << indent << Stream::get_var_decl(v) << ";" << std::endl;
        }

        // modports
        auto interface_definition = std::static_pointer_cast<InterfaceDefinition>(i_def);
        auto const& mod_ports = interface_definition->mod_ports();
        for (auto const& [mod_name, mod_port] : mod_ports) {
            stream << indent << "modport " << mod_name << "(";
            auto const& ports = mod_port->ports();
            if (ports.empty()) throw UserException(::format("{0} is empty", mod_name));
            auto const& inputs = mod_port->inputs();
            auto const& outputs = mod_port->outputs();
            uint32_t count = 0;
            for (auto const& name : inputs) {
                stream << "input " << name;
                if (++count != ports.size()) stream << ", ";
            }
            for (auto const& name : outputs) {
                stream << "output " << name;
                if (++count != ports.size()) stream << ", ";
            }
            stream << ");" << std::endl;
        }
        stream << "endinterface" << std::endl;
        result.emplace(interface_name, stream.str());
    }
    return result;
}